

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O0

void __thiscall
assembler::VirtualChannel::process
          (VirtualChannel *this,
          unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *tpdu,
          vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
          *out)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  mapped_type_conflict1 *pmVar5;
  uint *puVar6;
  pointer ppVar7;
  void *pvVar8;
  size_t sVar9;
  runtime_error *this_00;
  int *in_RDI;
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *spdu_2;
  iterator it_1;
  __single_object spdu;
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *spdu_1;
  iterator it;
  uint flag;
  int skip;
  uint seq;
  uint apid;
  map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  *in_stack_fffffffffffffd88;
  TransportPDU *in_stack_fffffffffffffd90;
  map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  *this_01;
  TransportPDU *in_stack_fffffffffffffd98;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffda0;
  SessionPDU *in_stack_fffffffffffffda8;
  uint *in_stack_fffffffffffffdb0;
  string *psVar10;
  int *in_stack_fffffffffffffdb8;
  key_type *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
  *in_stack_fffffffffffffdd8;
  VirtualChannel *in_stack_fffffffffffffde0;
  SessionPDU *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffe00;
  TransportPDU *in_stack_fffffffffffffe10;
  SessionPDU *in_stack_fffffffffffffe18;
  undefined1 local_150 [56];
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *local_118;
  _Self local_110;
  uint local_104;
  _Self local_100;
  undefined1 local_f5;
  undefined4 local_f4;
  string local_f0 [16];
  int *in_stack_ffffffffffffff20;
  char (*in_stack_ffffffffffffff28) [2];
  char (*in_stack_ffffffffffffff30) [103];
  undefined1 in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff39;
  string local_80 [32];
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *local_60;
  _Self local_58;
  uint local_4c;
  _Self local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  int local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
  operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *)
             0x2da28f);
  local_1c = TransportPDU::apid(in_stack_fffffffffffffd90);
  if (local_1c != 0x7ff) {
    std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
    operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *
               )0x2da2bd);
    bVar2 = TransportPDU::verifyCRC(in_stack_fffffffffffffd98);
    if (bVar2) {
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                  *)0x2da38e);
      local_28 = TransportPDU::sequenceCount(in_stack_fffffffffffffd90);
      local_2c = local_1c;
      sVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                        (in_stack_fffffffffffffda0,(key_type *)in_stack_fffffffffffffd98);
      if (sVar4 != 0) {
        local_34 = local_1c;
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator[]
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                   in_stack_fffffffffffffdc8);
        local_30 = diffWithWrap<16384u>
                             ((uint)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                              (uint)in_stack_fffffffffffffe00);
        local_30 = local_30 + -1;
        if (0 < local_30) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"VC ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RDI);
          poVar3 = std::operator<<(poVar3,": Detected TP_PDU drop");
          poVar3 = std::operator<<(poVar3," (skipped ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_30);
          poVar3 = std::operator<<(poVar3," packet(s)");
          poVar3 = std::operator<<(poVar3," on APID ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
          poVar3 = std::operator<<(poVar3,"; prev: ");
          local_38 = local_1c;
          pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                              in_stack_fffffffffffffdc8);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pmVar5);
          poVar3 = std::operator<<(poVar3,", packet: ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
          poVar3 = std::operator<<(poVar3,")");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
      uVar1 = local_28;
      local_3c = local_1c;
      puVar6 = (uint *)std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                                  in_stack_fffffffffffffdc8);
      *puVar6 = uVar1;
      std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
      operator->((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                  *)0x2da570);
      local_40 = TransportPDU::sequenceFlag((TransportPDU *)0x2da578);
      if ((local_40 == 3) || (local_40 == 1)) {
        local_4c = local_1c;
        local_48._M_node =
             (_Base_ptr)
             std::
             map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
             ::find(in_stack_fffffffffffffd88,(key_type *)0x2da5be);
        local_58._M_node =
             (_Base_ptr)
             std::
             map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
             ::end(in_stack_fffffffffffffd88);
        bVar2 = std::operator!=(&local_48,&local_58);
        if (bVar2) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"VC ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RDI);
          poVar3 = std::operator<<(poVar3,": New S_PDU for ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
          poVar3 = std::operator<<(poVar3,", but didn\'t finish previous one");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                                 *)0x2da66b);
          local_60 = &ppVar7->second;
          std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
          operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                      *)0x2da684);
          bVar2 = SessionPDU::finish(in_stack_fffffffffffffda8);
          if (bVar2) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"VC ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RDI);
            poVar3 = std::operator<<(poVar3,": Finished S_PDU for APID ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
            poVar3 = std::operator<<(poVar3," (");
            std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
            operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                        *)0x2da6fc);
            SessionPDU::getName_abi_cxx11_(in_stack_fffffffffffffde8);
            poVar3 = std::operator<<(poVar3,local_80);
            poVar3 = std::operator<<(poVar3,")");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_80);
            std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
            unique_ptr((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                        *)in_stack_fffffffffffffd90,
                       (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                        *)in_stack_fffffffffffffd88);
            finish(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                   (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
            std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
            ~unique_ptr((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                         *)in_stack_fffffffffffffda0);
          }
          std::
          map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
          ::erase((map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                   *)in_stack_fffffffffffffd90,(key_type *)in_stack_fffffffffffffd88);
        }
        std::make_unique<assembler::SessionPDU,int&,unsigned_int&>
                  (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
        operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *
                   )0x2da864);
        std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
        operator*((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                   *)in_stack_fffffffffffffd90);
        bVar2 = SessionPDU::append(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        if (bVar2) {
          if (local_40 == 3) {
            std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
            operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                        *)0x2da97b);
            sVar9 = SessionPDU::size((SessionPDU *)0x2da983);
            if (sVar9 == 0) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"VC ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RDI);
              poVar3 = std::operator<<(poVar3,": Zero length S_PDU for APID ");
              pvVar8 = (void *)std::ostream::operator<<(poVar3,local_1c);
              std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
            }
            else {
              std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
              unique_ptr((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                          *)in_stack_fffffffffffffd90,
                         (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                          *)in_stack_fffffffffffffd88);
              finish(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                     (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
              std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
              ~unique_ptr((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                           *)in_stack_fffffffffffffda0);
            }
          }
          else {
            std::
            make_pair<unsigned_int&,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>
                      ((uint *)in_stack_fffffffffffffd98,
                       (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                        *)in_stack_fffffffffffffd90);
            std::
            map<int,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>>
            ::
            insert<std::pair<unsigned_int,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>
                      ((map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                        *)in_stack_fffffffffffffda0,
                       (pair<unsigned_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>
                        *)in_stack_fffffffffffffd98);
            std::
            pair<unsigned_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>
            ::~pair((pair<unsigned_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>
                     *)0x2dab01);
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"VC ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RDI);
          poVar3 = std::operator<<(poVar3,": Invalid first S_PDU for APID ");
          pvVar8 = (void *)std::ostream::operator<<(poVar3,local_1c);
          std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        }
        std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
        ~unique_ptr((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                     *)in_stack_fffffffffffffda0);
      }
      else {
        if ((local_40 != 0) && (local_40 != 2)) {
          local_f5 = 1;
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_f4 = 0xe1;
          util::str<char[46],char[103],char[2],int>
                    ((char (*) [46])CONCAT71(in_stack_ffffffffffffff39,in_stack_ffffffffffffff38),
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
          std::runtime_error::runtime_error(this_00,local_f0);
          local_f5 = 0;
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_104 = local_1c;
        local_100._M_node =
             (_Base_ptr)
             std::
             map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
             ::find(in_stack_fffffffffffffd88,(key_type *)0x2dac6c);
        local_110._M_node =
             (_Base_ptr)
             std::
             map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
             ::end(in_stack_fffffffffffffd88);
        bVar2 = std::operator==(&local_100,&local_110);
        if (!bVar2) {
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                                 *)0x2dacba);
          local_118 = &ppVar7->second;
          std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
          operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                      *)0x2dacd3);
          std::unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>::
          operator*((unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                     *)in_stack_fffffffffffffd90);
          bVar2 = SessionPDU::append(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
          if (bVar2) {
            if (local_40 == 2) {
              this_01 = (map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                         *)local_150;
              std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
              unique_ptr((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                          *)this_01,
                         (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                          *)in_stack_fffffffffffffd88);
              finish(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                     (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
              std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
              ~unique_ptr((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                           *)in_stack_fffffffffffffda0);
              std::
              map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
              ::erase(this_01,(key_type *)in_stack_fffffffffffffd88);
            }
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cerr,"VC ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RDI);
            poVar3 = std::operator<<(poVar3,": Unable to append to S_PDU on APID ");
            pvVar8 = (void *)std::ostream::operator<<(poVar3,local_1c);
            std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
            std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
            operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                        *)0x2dad59);
            bVar2 = SessionPDU::finish(in_stack_fffffffffffffda8);
            if (bVar2) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"VC ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RDI);
              poVar3 = std::operator<<(poVar3,": Finished S_PDU for APID ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
              poVar3 = std::operator<<(poVar3," (");
              std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
              operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                          *)0x2dadce);
              psVar10 = (string *)(local_150 + 0x18);
              SessionPDU::getName_abi_cxx11_(in_stack_fffffffffffffde8);
              poVar3 = std::operator<<(poVar3,psVar10);
              poVar3 = std::operator<<(poVar3,")");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)(local_150 + 0x18));
              std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
              unique_ptr((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                          *)in_stack_fffffffffffffd90,
                         (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                          *)in_stack_fffffffffffffd88);
              finish(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                     (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
              std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
              ~unique_ptr((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                           *)poVar3);
            }
            local_150._12_4_ = local_1c;
            std::
            map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
            ::erase((map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                     *)in_stack_fffffffffffffd90,(key_type *)in_stack_fffffffffffffd88);
          }
        }
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"VC ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*in_RDI);
      poVar3 = std::operator<<(poVar3,": CRC failure; dropping TP_PDU (APID ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_20 = local_1c;
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::erase
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 in_stack_fffffffffffffd90,(key_type *)in_stack_fffffffffffffd88);
      local_24 = local_1c;
      std::
      map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
      ::erase((map<int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
               *)in_stack_fffffffffffffd90,(key_type *)in_stack_fffffffffffffd88);
    }
  }
  return;
}

Assistant:

void VirtualChannel::process(
    std::unique_ptr<TransportPDU> tpdu,
    std::vector<std::unique_ptr<SessionPDU>>& out) {
  auto apid = tpdu->apid();

  // Ignore fill packets
  if (apid == 2047) {
    return;
  }

  // Verify CRC is correct
  if (!tpdu->verifyCRC()) {
    std::cerr
      << "VC "
      << id_
      << ": CRC failure; dropping TP_PDU (APID " << apid << ")"
      << std::endl;

    // Clear state for this APID.
    apidSeq_.erase(apid);
    apidSessionPDU_.erase(apid);
    return;
  }

  // The sequence counter is described as (section 6.2.1):
  //
  // > 14-bit packet sequence count, straight sequential count (modulo
  // > 16384) that numbers each source packet generated per APID.
  //
  // Sanity check on this counter to protect against drops.
  //
  auto seq = tpdu->sequenceCount();
  if (apidSeq_.count(apid) > 0) {
    auto skip = diffWithWrap<16384>(apidSeq_[apid], seq) - 1;
    if (skip > 0) {
      std::cerr
        << "VC "
        << id_
        << ": Detected TP_PDU drop"
        << " (skipped " << skip << " packet(s)"
        << " on APID " << apid
        << "; prev: " << apidSeq_[apid]
        << ", packet: " << seq
        << ")"
        << std::endl;
    }
  }
  apidSeq_[apid] = seq;

  // Sequence Flag:
  // - Set to 3 if the user data contains one user data file entirely;
  // - Set to 1 if the user data contains the first segment of one user
  //   data file extending through subsequent packets;
  // - Set to 0 if the user data contains a continuation segment of one
  //   user data file still extending through subsequent packets;
  // - Set to 2 if the user data contains the last segment of a user data
  //   file beginning in an earlier packet.
  auto flag = tpdu->sequenceFlag();
  if (flag == 3 || flag == 1) {
    auto it = apidSessionPDU_.find(apid);
    if (it != apidSessionPDU_.end()) {
      std::cerr
        << "VC "
        << id_
        << ": New S_PDU for "
        << apid
        << ", but didn't finish previous one"
        << std::endl;

      // Try to finish pending S_PDU
      auto& spdu = it->second;
      if (spdu->finish()) {
        std::cerr
          << "VC "
          << id_
          << ": Finished S_PDU for APID "
          << apid
          << " (" << spdu->getName() << ")"
          << std::endl;
        finish(std::move(spdu), out);
      }

      // Erase pending S_PDU as it won't be finished now
      apidSessionPDU_.erase(apid);
    }

    auto spdu = std::make_unique<SessionPDU>(id_, apid);
    if (!spdu->append(*tpdu)) {
      std::cerr
        << "VC "
        << id_
        << ": Invalid first S_PDU for APID "
        << apid
        << std::endl;
    } else {
      // Check if this S_PDU is contained in a single TP_PDU
      if (flag == 3) {
        if (spdu->size() == 0) {
          std::cerr
            << "VC "
            << id_
            << ": Zero length S_PDU for APID "
            << apid
            << std::endl;
        } else {
          finish(std::move(spdu), out);
        }
      } else {
        // Expecting subsequent TP_PDUs to fill this S_PDU
        apidSessionPDU_.insert(std::make_pair(apid, std::move(spdu)));
      }
    }
  } else {
    ASSERT(flag == 0 || flag == 2);

    auto it = apidSessionPDU_.find(apid);
    if (it == apidSessionPDU_.end()) {
      // This is not a valid continuation
      if (false) {
        std::cerr
          << "VC "
          << id_
          << ": Expected to have part of S_PDU for APID "
          << apid
          << std::endl;
      }
    } else {
      // Append data from TP_PDU to S_PDU
      auto& spdu = it->second;
      if (!spdu->append(*tpdu)) {
        std::cerr
          << "VC "
          << id_
          << ": Unable to append to S_PDU on APID "
          << apid
          << std::endl;

        // Unable to append; perhaps this continuation belongs
        // to the next S_PDU on this APID and everything in between
        // was dropped. Try to finish at least the previous S_PDU.
        if (spdu->finish()) {
          std::cerr
            << "VC "
            << id_
            << ": Finished S_PDU for APID "
            << apid
            << " (" << spdu->getName() << ")"
            << std::endl;
          finish(std::move(spdu), out);
        }

        // Erase S_PDU regardless if it was finished or not
        apidSessionPDU_.erase(apid);
      } else {
        // Successfully appended TP_PDU to S_PDU
        if (flag == 2) {
          finish(std::move(spdu), out);
          apidSessionPDU_.erase(apid);
        }
      }
    }
  }
}